

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_pipeline.hpp
# Opt level: O1

void __thiscall
tf::
DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:1066:59)>_>
::_on_pipe(DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
           *this,Pipeflow *pf,Runtime *param_2)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  size_t sVar2;
  code *pcVar3;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  bool bVar4;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  int iVar5;
  variant_alternative_t<0UL,_variant<int,_monostate>_> *pvVar6;
  size_t *psVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  double extraout_XMM0_Qa_14;
  double extraout_XMM0_Qa_15;
  double extraout_XMM0_Qa_16;
  double dVar8;
  double extraout_XMM0_Qa_17;
  double extraout_XMM0_Qa_18;
  double extraout_XMM0_Qa_19;
  double extraout_XMM0_Qa_20;
  ResultBuilder DOCTEST_RB;
  Result local_e0;
  ResultBuilder local_c0;
  int local_44;
  Expression_lhs<const_unsigned_long_&> local_40;
  size_t local_30;
  
  switch(pf->_pipe) {
  case 0:
    psVar7 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
             .
             super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_false>
             ._M_head_impl._callable.j1_1;
    if (*psVar7 ==
        (this->_pipes).
        super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
        .
        super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_false>
        ._M_head_impl._callable.N) {
      if (pf->_pipe != 0) {
        throw_re<char_const(&)[39]>
                  ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                   ,0x95,(char (*) [39])"only the first pipe can stop the token");
      }
      pf->_stop = true;
      iVar5 = 0;
    }
    else {
      local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_c0.super_AssertData.m_at = DT_REQUIRE;
      local_c0.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      local_c0.super_AssertData.m_line = 0x411;
      local_c0.super_AssertData.m_expr = "j1_1 == source[j1_1]";
      local_c0.super_AssertData.m_failed = true;
      local_c0.super_AssertData.m_threw = false;
      local_c0.super_AssertData.m_threw_as = false;
      local_c0.super_AssertData.m_exception_type = "";
      local_c0.super_AssertData.m_exception_string = "";
      local_40.m_at = DT_REQUIRE;
      local_40.lhs = psVar7;
      doctest::detail::Expression_lhs<const_unsigned_long_&>::operator==<int,_nullptr>
                (&local_e0,&local_40,
                 (((this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                   .
                   super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_false>
                   ._M_head_impl._callable.source)->super__Vector_base<int,_std::allocator<int>_>).
                 _M_impl.super__Vector_impl_data._M_start + *psVar7);
      doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
      local_c0.super_AssertData._40_2_ =
           CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
      dVar8 = extraout_XMM0_Qa_17;
      if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_e0.m_decomp.field_0.data.ptr);
        dVar8 = extraout_XMM0_Qa_18;
      }
      doctest::detail::ResultBuilder::log(&local_c0,dVar8);
      if (extraout_AL_08 != '\0') {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      if ((local_c0.super_AssertData.m_failed == true) &&
         (bVar4 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar4)) {
        doctest::detail::throwException();
      }
      if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                           local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                           local_c0.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                           local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                           local_c0.super_AssertData.m_exception.field_0.buf[0]));
      }
      local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_c0.super_AssertData.m_at = DT_REQUIRE;
      local_c0.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      local_c0.super_AssertData.m_line = 0x412;
      local_c0.super_AssertData.m_expr = "pf.token() % L == pf.line()";
      local_c0.super_AssertData.m_failed = true;
      local_c0.super_AssertData.m_threw = false;
      local_c0.super_AssertData.m_threw_as = false;
      local_c0.super_AssertData.m_exception_type = "";
      local_c0.super_AssertData.m_exception_string = "";
      local_40.lhs = (unsigned_long *)
                     (pf->_token %
                     (this->_pipes).
                     super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                     .
                     super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_false>
                     ._M_head_impl._callable.L);
      local_40.m_at = DT_REQUIRE;
      local_30 = pf->_line;
      doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_40,&local_30);
      doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
      local_c0.super_AssertData._40_2_ =
           CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
      dVar8 = extraout_XMM0_Qa_19;
      if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_e0.m_decomp.field_0.data.ptr);
        dVar8 = extraout_XMM0_Qa_20;
      }
      doctest::detail::ResultBuilder::log(&local_c0,dVar8);
      if (extraout_AL_09 != '\0') {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      if ((local_c0.super_AssertData.m_failed == true) &&
         (bVar4 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar4)) {
        doctest::detail::throwException();
      }
      if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                           local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                           local_c0.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                           local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                           local_c0.super_AssertData.m_exception.field_0.buf[0]));
      }
      pvVar1 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
               .
               super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_false>
               ._M_head_impl._callable.source;
      psVar7 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
               .
               super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_false>
               ._M_head_impl._callable.j1_1;
      sVar2 = *psVar7;
      *psVar7 = sVar2 + 1;
      iVar5 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[sVar2] + 1;
    }
    goto LAB_001400b2;
  case 1:
    pvVar6 = std::get<0ul,int,std::monostate>
                       (&(this->_buffer).
                         super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_44 = *pvVar6;
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0x419;
    local_c0.super_AssertData.m_expr = "j1_2 < N";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    local_40.lhs = (this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                   .
                   super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                   .
                   super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_false>
                   ._M_head_impl._callable.j1_2;
    local_40.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
              (&local_e0,&local_40,
               &(this->_pipes).
                super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                .
                super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                .
                super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_false>
                ._M_head_impl._callable.N);
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa_11;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_12;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar8);
    if (extraout_AL_05 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if ((local_c0.super_AssertData.m_failed == true) &&
       (bVar4 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar4)) {
      doctest::detail::throwException();
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0x41a;
    local_c0.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    local_40.lhs = (unsigned_long *)
                   (pf->_token %
                   (this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                   .
                   super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                   .
                   super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_false>
                   ._M_head_impl._callable.L);
    local_40.m_at = DT_REQUIRE;
    local_30 = pf->_line;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_40,&local_30);
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa_13;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_14;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar8);
    if (extraout_AL_06 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if ((local_c0.super_AssertData.m_failed == true) &&
       (bVar4 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar4)) {
      doctest::detail::throwException();
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0x41b;
    local_c0.super_AssertData.m_expr = "source[j1_2] + 1 == input";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    local_40.lhs = (unsigned_long *)
                   ((ulong)((((this->_pipes).
                              super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                              .
                              super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                              .
                              super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_false>
                              ._M_head_impl._callable.source)->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start
                            [*(this->_pipes).
                              super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                              .
                              super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                              .
                              super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_false>
                              ._M_head_impl._callable.j1_2] + 1) | 0xc00000000);
    doctest::detail::Expression_lhs<const_int>::operator==<int,_nullptr>
              (&local_e0,(Expression_lhs<const_int> *)&local_40,&local_44);
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa_15;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_16;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar8);
    if (extraout_AL_07 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if ((local_c0.super_AssertData.m_failed == true) &&
       (bVar4 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar4)) {
      doctest::detail::throwException();
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
    psVar7 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
             .
             super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
             .
             super__Head_base<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_false>
             ._M_head_impl._callable.j1_2;
    break;
  case 2:
    pvVar6 = std::get<0ul,int,std::monostate>
                       (&(this->_buffer).
                         super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_44 = *pvVar6;
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0x422;
    local_c0.super_AssertData.m_expr = "j1_3 < N";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    local_40.lhs = *(size_t **)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Head_base<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_false>
                            ._M_head_impl._callable + 0x10);
    local_40.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
              (&local_e0,&local_40,
               &(this->_pipes).
                super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                .
                super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                .
                super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                .
                super__Head_base<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_false>
                ._M_head_impl._callable.N);
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_00;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar8);
    if (extraout_AL != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if ((local_c0.super_AssertData.m_failed == true) &&
       (bVar4 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar4)) {
      doctest::detail::throwException();
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0x423;
    local_c0.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    local_40.lhs = (unsigned_long *)
                   (pf->_token %
                   *(size_t *)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Head_base<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_false>
                            ._M_head_impl._callable + 0x18));
    local_40.m_at = DT_REQUIRE;
    local_30 = pf->_line;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_40,&local_30);
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa_01;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_02;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar8);
    if (extraout_AL_00 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if ((local_c0.super_AssertData.m_failed == true) &&
       (bVar4 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar4)) {
      doctest::detail::throwException();
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0x424;
    local_c0.super_AssertData.m_expr = "source[j1_3] + 1 == input";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    local_40.lhs = (unsigned_long *)
                   ((ulong)(((*(vector<int,_std::allocator<int>_> **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Head_base<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_false>
                                       ._M_head_impl._callable + 8))->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start
                            [**(size_t **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Head_base<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_false>
                                       ._M_head_impl._callable + 0x10)] + 1) | 0xc00000000);
    doctest::detail::Expression_lhs<const_int>::operator==<int,_nullptr>
              (&local_e0,(Expression_lhs<const_int> *)&local_40,&local_44);
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa_03;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_04;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar8);
    if (extraout_AL_01 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if ((local_c0.super_AssertData.m_failed == true) &&
       (bVar4 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar4)) {
      doctest::detail::throwException();
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
    psVar7 = *(size_t **)
              ((long)&(this->_pipes).
                      super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                      .
                      super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                      .
                      super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                      .
                      super__Head_base<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_false>
                      ._M_head_impl._callable + 0x10);
    break;
  case 3:
    pvVar6 = std::get<0ul,int,std::monostate>
                       (&(this->_buffer).
                         super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_44 = *pvVar6;
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0x42b;
    local_c0.super_AssertData.m_expr = "j1_4 < N";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    local_40.lhs = *(size_t **)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>,_false>
                            ._M_head_impl + 0x18);
    local_40.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
              (&local_e0,&local_40,
               (unsigned_long *)
               ((long)&(this->_pipes).
                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                       .
                       super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                       .
                       super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                       .
                       super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                       .
                       super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>,_false>
                       ._M_head_impl + 8));
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa_05;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_06;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar8);
    if (extraout_AL_02 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if ((local_c0.super_AssertData.m_failed == true) &&
       (bVar4 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar4)) {
      doctest::detail::throwException();
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0x42c;
    local_c0.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    local_40.lhs = (unsigned_long *)
                   (pf->_token %
                   *(size_t *)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                            .
                            super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>,_false>
                            ._M_head_impl + 0x20));
    local_40.m_at = DT_REQUIRE;
    local_30 = pf->_line;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_e0,(Expression_lhs<unsigned_long_const> *)&local_40,&local_30);
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa_07;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_08;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar8);
    if (extraout_AL_03 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if ((local_c0.super_AssertData.m_failed == true) &&
       (bVar4 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar4)) {
      doctest::detail::throwException();
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
    local_c0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_c0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_c0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_c0.super_AssertData.m_at = DT_REQUIRE;
    local_c0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    local_c0.super_AssertData.m_line = 0x42d;
    local_c0.super_AssertData.m_expr = "source[j1_4] + 1 == input";
    local_c0.super_AssertData.m_failed = true;
    local_c0.super_AssertData.m_threw = false;
    local_c0.super_AssertData.m_threw_as = false;
    local_c0.super_AssertData.m_exception_type = "";
    local_c0.super_AssertData.m_exception_string = "";
    local_40.lhs = (unsigned_long *)
                   ((ulong)(((*(vector<int,_std::allocator<int>_> **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>,_false>
                                       ._M_head_impl + 0x10))->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start
                            [**(size_t **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                                       .
                                       super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>,_false>
                                       ._M_head_impl + 0x18)] + 1) | 0xc00000000);
    doctest::detail::Expression_lhs<const_int>::operator==<int,_nullptr>
              (&local_e0,(Expression_lhs<const_int> *)&local_40,&local_44);
    doctest::String::operator=(&local_c0.super_AssertData.m_decomp,&local_e0.m_decomp);
    local_c0.super_AssertData._40_2_ =
         CONCAT11(local_c0.super_AssertData.m_threw,local_e0.m_passed) ^ 1;
    dVar8 = extraout_XMM0_Qa_09;
    if ((local_e0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_e0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_e0.m_decomp.field_0.data.ptr);
      dVar8 = extraout_XMM0_Qa_10;
    }
    doctest::detail::ResultBuilder::log(&local_c0,dVar8);
    if (extraout_AL_04 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    if ((local_c0.super_AssertData.m_failed == true) &&
       (bVar4 = doctest::detail::checkIfShouldThrow(local_c0.super_AssertData.m_at), bVar4)) {
      doctest::detail::throwException();
    }
    if ((local_c0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                         local_c0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_c0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_c0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                         local_c0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_c0.super_AssertData.m_exception.field_0._1_7_,
                                         local_c0.super_AssertData.m_exception.field_0.buf[0]));
    }
    psVar7 = *(size_t **)
              ((long)&(this->_pipes).
                      super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1036:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                      .
                      super__Tuple_impl<1UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1048:58)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                      .
                      super__Tuple_impl<2UL,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1057:58)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                      .
                      super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>_>
                      .
                      super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1066:59)>,_false>
                      ._M_head_impl + 0x18);
    *psVar7 = *psVar7 + 1;
  default:
    goto switchD_0013f376_default;
  }
  *psVar7 = *psVar7 + 1;
  iVar5 = local_44;
LAB_001400b2:
  local_c0.super_AssertData.m_test_case =
       (TestCaseData *)CONCAT44(local_c0.super_AssertData.m_test_case._4_4_,iVar5);
  std::variant<int,std::monostate>::operator=
            ((variant<int,std::monostate> *)
             ((this->_buffer).
              super__Vector_base<tf::CachelineAligned<std::variant<int,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::monostate>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + pf->_line),(int *)&local_c0);
switchD_0013f376_default:
  return;
}

Assistant:

void DataPipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime&) {

  visit_tuple([&](auto&& pipe){

    using data_pipe_t = std::decay_t<decltype(pipe)>;
    using callable_t  = typename data_pipe_t::callable_t;
    using input_t     = std::decay_t<typename data_pipe_t::input_t>;
    using output_t    = std::decay_t<typename data_pipe_t::output_t>;
    
    // first pipe
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      // [](tf::Pipeflow&) -> void {}, i.e., we only have one pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(pf);
      // [](tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(pf);
      }
    }
    // other pipes without pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, std::add_lvalue_reference_t<input_t> >) {
      // [](input_t&) -> void {}, i.e., the last pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data));
      // [](input_t&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data)
        );
      }
    }
    // other pipes with pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, input_t&, Pipeflow&>) {
      // [](input_t&, tf::Pipeflow&) -> void {}
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data), pf);
      // [](input_t&, tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data), pf
        );
      }
    }
    //else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
    //  pipe._callable(pf, rt);
    //}
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}